

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testutil.h
# Opt level: O0

void testutil_random_fe_test(secp256k1_fe *x)

{
  int iVar1;
  uchar bin [32];
  secp256k1_fe *in_stack_ffffffffffffffd8;
  
  do {
    testrand256_test((uchar *)0x136fc1);
    iVar1 = secp256k1_fe_set_b32_limit(in_stack_ffffffffffffffd8,(uchar *)0x136fce);
  } while (iVar1 == 0);
  return;
}

Assistant:

static void testutil_random_fe_test(secp256k1_fe *x) {
    unsigned char bin[32];
    do {
        testrand256_test(bin);
        if (secp256k1_fe_set_b32_limit(x, bin)) {
            return;
        }
    } while(1);
}